

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Close(sqlite3 *db,int forceZombie)

{
  Schema *pSVar1;
  Table *p;
  int iVar2;
  long lVar3;
  HashElem *pHVar4;
  
  if (db != (sqlite3 *)0x0) {
    iVar2 = sqlite3SafetyCheckSickOrOk(db);
    if (iVar2 == 0) {
      iVar2 = sqlite3MisuseError(0x29f64);
      return iVar2;
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    if ((db->mTrace & 8) != 0) {
      (*(db->trace).xLegacy)((void *)0x8,(char *)db->pTraceArg);
    }
    sqlite3BtreeEnterAll(db);
    for (lVar3 = 0; lVar3 < db->nDb; lVar3 = lVar3 + 1) {
      pSVar1 = db->aDb[lVar3].pSchema;
      if (pSVar1 != (Schema *)0x0) {
        pHVar4 = (HashElem *)&(pSVar1->tblHash).first;
        while (pHVar4 = pHVar4->next, pHVar4 != (HashElem *)0x0) {
          if (((Table *)pHVar4->data)->eTabType == '\x01') {
            sqlite3VtabDisconnect(db,(Table *)pHVar4->data);
          }
        }
      }
    }
    pHVar4 = (HashElem *)&(db->aModule).first;
    while (pHVar4 = pHVar4->next, pHVar4 != (HashElem *)0x0) {
      p = *(Table **)((long)pHVar4->data + 0x28);
      if (p != (Table *)0x0) {
        sqlite3VtabDisconnect(db,p);
      }
    }
    sqlite3VtabUnlockList(db);
    sqlite3BtreeLeaveAll(db);
    sqlite3VtabRollback(db);
    if ((forceZombie == 0) && (iVar2 = connectionIsBusy(db), iVar2 != 0)) {
      sqlite3ErrorWithMsg(db,5,"unable to close due to unfinalized statements or unfinished backups"
                         );
      if (db->mutex == (sqlite3_mutex *)0x0) {
        return 5;
      }
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      return 5;
    }
    db->eOpenState = 0xa7;
    sqlite3LeaveMutexAndCloseZombie(db);
  }
  return 0;
}

Assistant:

static int sqlite3Close(sqlite3 *db, int forceZombie){
  if( !db ){
    /* EVIDENCE-OF: R-63257-11740 Calling sqlite3_close() or
    ** sqlite3_close_v2() with a NULL pointer argument is a harmless no-op. */
    return SQLITE_OK;
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  if( db->mTrace & SQLITE_TRACE_CLOSE ){
    db->trace.xV2(SQLITE_TRACE_CLOSE, db->pTraceArg, db, 0);
  }

  /* Force xDisconnect calls on all virtual tables */
  disconnectAllVtab(db);

  /* If a transaction is open, the disconnectAllVtab() call above
  ** will not have called the xDisconnect() method on any virtual
  ** tables in the db->aVTrans[] array. The following sqlite3VtabRollback()
  ** call will do so. We need to do this before the check for active
  ** SQL statements below, as the v-table implementation may be storing
  ** some prepared statements internally.
  */
  sqlite3VtabRollback(db);

  /* Legacy behavior (sqlite3_close() behavior) is to return
  ** SQLITE_BUSY if the connection can not be closed immediately.
  */
  if( !forceZombie && connectionIsBusy(db) ){
    sqlite3ErrorWithMsg(db, SQLITE_BUSY, "unable to close due to unfinalized "
       "statements or unfinished backups");
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_BUSY;
  }

#ifdef SQLITE_ENABLE_SQLLOG
  if( sqlite3GlobalConfig.xSqllog ){
    /* Closing the handle. Fourth parameter is passed the value 2. */
    sqlite3GlobalConfig.xSqllog(sqlite3GlobalConfig.pSqllogArg, db, 0, 2);
  }
#endif

  /* Convert the connection into a zombie and then close it.
  */
  db->eOpenState = SQLITE_STATE_ZOMBIE;
  sqlite3LeaveMutexAndCloseZombie(db);
  return SQLITE_OK;
}